

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O3

void __thiscall AllFloatsRoundtripTest::RunShard(AllFloatsRoundtripTest *this,int shard)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  uint32_t bits;
  ulong uVar4;
  LiteralType literal_type;
  char *message;
  bool bVar5;
  uint32_t new_bits;
  char buffer [100];
  uint32_t local_cc;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  Message local_b8;
  int local_ac;
  AssertHelper local_a8;
  uint32_t local_9c;
  char local_98 [104];
  
  local_ac = -1;
  uVar4 = (ulong)(uint)shard;
  local_cc = shard;
  while( true ) {
    bits = (uint32_t)uVar4;
    if ((shard == 0) && (iVar3 = (int)(uVar4 >> 0x18), iVar3 != local_ac)) {
      printf("value: 0x%08x (%d%%)\r",uVar4,
             (ulong)(uint)(int)(((double)uVar4 * 100.0) / 4294967295.0));
      fflush(_stdout);
      bits = local_cc;
      local_ac = iVar3;
    }
    wabt::WriteFloatHex(local_98,100,bits);
    sVar2 = strlen(local_98);
    local_b8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    literal_type = Nan - ((local_cc & 0x7fffff) == 0);
    if ((~local_cc & 0x7f800000) != 0) {
      literal_type = Hexfloat;
    }
    local_a8.data_._0_4_ = wabt::ParseFloat(literal_type,local_98,local_98 + (int)sVar2,&local_9c);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_c8,"Result::Ok",
               "ParseFloat(ClassifyFloat(bits), buffer, buffer + len, &new_bits)",(Enum *)&local_b8,
               (Result *)&local_a8);
    if (local_c8[0] == (internal)0x0) break;
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (local_c8,"new_bits","bits",&local_9c,&local_cc);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message(&local_b8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_c0->_M_dataplus)._M_p;
      }
      iVar3 = 0xa9;
      goto LAB_0010b2ff;
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    uVar1 = (this->super_ThreadedTest).num_threads_;
    bVar5 = CARRY4(uVar1,local_cc);
    local_cc = uVar1 + local_cc;
    uVar4 = (ulong)local_cc;
    if (bVar5) {
      if (shard == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
  }
  testing::Message::Message(&local_b8);
  if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = (local_c0->_M_dataplus)._M_p;
  }
  iVar3 = 0xa8;
LAB_0010b2ff:
  testing::internal::AssertHelper::AssertHelper
            (&local_a8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-hexfloat.cc"
             ,iVar3,message);
  testing::internal::AssertHelper::operator=(&local_a8,&local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_a8);
  if ((long *)CONCAT44(local_b8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_b8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_b8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_b8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
  if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c0,local_c0);
  return;
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      WriteFloatHex(buffer, sizeof(buffer), bits);
      int len = strlen(buffer);

      uint32_t new_bits;
      ASSERT_EQ(Result::Ok, ParseFloat(ClassifyFloat(bits), buffer,
                                       buffer + len, &new_bits));
      ASSERT_EQ(new_bits, bits);
    }
    LOG_DONE();
  }